

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process-list.cpp
# Opt level: O2

void __thiscall dynamicgraph::CPU::System::readProcStat(System *this)

{
  uint uVar1;
  istream *piVar2;
  long lVar3;
  pointer pCVar4;
  unsigned_long i;
  ulong uVar5;
  uint lcpunb;
  string line_hdr;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568 [16];
  string str_cpunbr;
  ifstream aif;
  istringstream iss;
  istringstream anISSLine;
  
  std::ifstream::ifstream(&aif);
  this->cpuNb_ = 1;
  std::ifstream::open((char *)&aif,0x12d098);
  local_578 = local_568;
  local_570 = 0;
  local_568[0] = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&aif,(string *)&local_578);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&anISSLine,(string *)&local_578,_S_in);
    line_hdr._M_dataplus._M_p = (pointer)&line_hdr.field_2;
    line_hdr._M_string_length = 0;
    line_hdr.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&anISSLine,(string *)&line_hdr);
    lVar3 = std::__cxx11::string::find((char *)&line_hdr,0x12d0a3);
    std::__cxx11::string::substr((ulong)&str_cpunbr,(ulong)&line_hdr);
    if (lVar3 == 0) {
      if (str_cpunbr._M_string_length == 0) {
        CPUData::ProcessLine(&this->gCPUData_,&anISSLine);
        (this->gCPUData_).cpu_id_ = -1;
      }
      else {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&iss,(string *)&str_cpunbr,_S_in);
        std::istream::_M_extract<unsigned_int>((uint *)&iss);
        if (this->init_ == false) {
          if (this->cpuNb_ < lcpunb) {
            this->cpuNb_ = lcpunb;
          }
        }
        else {
          ProcessCPULine(this,lcpunb,&anISSLine);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      }
    }
    std::__cxx11::string::~string((string *)&str_cpunbr);
    std::__cxx11::string::~string((string *)&line_hdr);
    std::__cxx11::istringstream::~istringstream((istringstream *)&anISSLine);
  }
  if (this->init_ == false) {
    std::vector<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>::resize
              (&this->vCPUData_,(ulong)(this->cpuNb_ + 1));
    uVar1 = this->cpuNb_;
    pCVar4 = (this->vCPUData_).
             super__Vector_base<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      pCVar4->cpu_id_ = (int)uVar5;
      pCVar4 = pCVar4 + 1;
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&local_578);
  std::ifstream::~ifstream(&aif);
  return;
}

Assistant:

void System::readProcStat() {
  std::ifstream aif;
  cpuNb_ = 1;

  aif.open("/proc/stat", std::ifstream::in);
  std::string aline;
  aline.clear();
  while (std::getline(aif, aline)) {
    // Read on line of the file
    std::istringstream anISSLine(aline);
    std::string line_hdr;
    anISSLine >> line_hdr;

    // Check if the line start with cpu
    std::size_t pos = line_hdr.find("cpu");
    std::string str_cpunbr = line_hdr.substr(pos + 3);

    // Check if this is the  first line
    if (pos == 0 and str_cpunbr.empty()) {
      gCPUData_.ProcessLine(anISSLine);
      gCPUData_.cpu_id_ = -1;
    } else {
      // If not then check if there is a CPU number
      if (pos == 0) {
        std::istringstream iss(str_cpunbr);
        unsigned int lcpunb;
        iss >> lcpunb;
        // If we did not initialize
        if (!init_) {
          // Count the number of CPU.
          if (lcpunb > cpuNb_) cpuNb_ = lcpunb;
        } else
          // Otherwise process the line.
          ProcessCPULine(lcpunb, anISSLine);
      }
    }
  }

  if (!init_) {
    /// The number of CPU has been detected by going through /proc/stat.
    vCPUData_.resize(cpuNb_ + 1);
    for (unsigned long i = 0; i < (unsigned long)cpuNb_; i++)
      vCPUData_[i].cpu_id_ = (int)i;
  }
  aif.close();
}